

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void __thiscall ImDrawDataBuilder::Clear(ImDrawDataBuilder *this)

{
  ImVector<ImDrawList_*> *pIVar1;
  bool bVar2;
  ImDrawList **__dest;
  long lVar3;
  bool bVar4;
  
  lVar3 = 0;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    pIVar1 = this->Layers + lVar3;
    if (this->Layers[lVar3].Capacity < 0) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      __dest = (ImDrawList **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      if (pIVar1->Data != (ImDrawList **)0x0) {
        memcpy(__dest,pIVar1->Data,(long)pIVar1->Size << 3);
        if (pIVar1->Data != (ImDrawList **)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pIVar1->Data,GImAllocatorUserData);
      }
      pIVar1->Data = __dest;
      pIVar1->Capacity = 0;
    }
    pIVar1->Size = 0;
    lVar3 = 1;
    bVar2 = false;
  } while (bVar4);
  return;
}

Assistant:

void Clear()            { for (int n = 0; n < IM_ARRAYSIZE(Layers); n++) Layers[n].resize(0); }